

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveData.cpp
# Opt level: O3

void __thiscall CDirectiveData::encodeFloat(CDirectiveData *this)

{
  pointer plVar1;
  int32_t iVar2;
  EncodingMode EVar3;
  EncodingMode EVar4;
  long lVar5;
  pointer pEVar6;
  char *text;
  iterator __position;
  ulong uVar7;
  int64_t num;
  ExpressionValue value;
  long local_70;
  vector<long,std::allocator<long>> *local_68;
  ExpressionValue local_60;
  
  plVar1 = (this->normalData).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->normalData).super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_finish != plVar1) {
    (this->normalData).super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_finish = plVar1;
  }
  pEVar6 = (this->entries).super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->entries).super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
      super__Vector_impl_data._M_finish != pEVar6) {
    local_68 = (vector<long,std::allocator<long>> *)&this->normalData;
    lVar5 = 0;
    uVar7 = 0;
    do {
      Expression::evaluate
                (&local_60,
                 (Expression *)
                 ((long)&(pEVar6->expression).
                         super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                 lVar5));
      text = "Invalid expression";
      if (local_60.type == Invalid) {
LAB_00184f61:
        Logger::queueError<>(Error,text);
      }
      else {
        EVar4 = this->mode ^ Float;
        if ((local_60.type ^ Integer) == Invalid && EVar4 == Invalid) {
          iVar2 = getFloatBits((float)local_60.field_1.intValue);
          local_70 = (long)iVar2;
          __position._M_current =
               (this->normalData).super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->normalData).super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                      ((vector<long,_std::allocator<long>_> *)local_68,__position,&local_70);
          }
          else {
LAB_00184f54:
            *__position._M_current = local_70;
            (this->normalData).super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
        }
        else {
          EVar3 = this->mode ^ Double;
          if ((local_60.type ^ Integer) == Invalid && EVar3 == Invalid) {
            local_70 = getDoubleBits((double)local_60.field_1.intValue);
            __position._M_current =
                 (this->normalData).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position._M_current !=
                (this->normalData).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) goto LAB_00184f54;
            std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                      (local_68,__position,&local_70);
          }
          else if (EVar4 == Invalid && (local_60.type ^ Float) == Invalid) {
            iVar2 = getFloatBits((float)local_60.field_1.floatValue);
            local_70 = (long)iVar2;
            __position._M_current =
                 (this->normalData).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position._M_current !=
                (this->normalData).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) goto LAB_00184f54;
            std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                      ((vector<long,_std::allocator<long>_> *)local_68,__position,&local_70);
          }
          else {
            text = "Invalid expression type";
            if ((local_60.type ^ Float) != Invalid || EVar3 != Invalid) goto LAB_00184f61;
            local_70 = getDoubleBits(local_60.field_1.floatValue);
            __position._M_current =
                 (this->normalData).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position._M_current !=
                (this->normalData).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) goto LAB_00184f54;
            std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                      (local_68,__position,&local_70);
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60.strValue._value._M_dataplus._M_p != &local_60.strValue._value.field_2) {
        operator_delete(local_60.strValue._value._M_dataplus._M_p,
                        local_60.strValue._value.field_2._M_allocated_capacity + 1);
      }
      uVar7 = uVar7 + 1;
      pEVar6 = (this->entries).super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x18;
    } while (uVar7 < (ulong)(((long)(this->entries).
                                    super__Vector_base<Expression,_std::allocator<Expression>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pEVar6 >> 3) *
                            -0x5555555555555555));
  }
  return;
}

Assistant:

void CDirectiveData::encodeFloat()
{
	normalData.clear();
	for (size_t i = 0; i < entries.size(); i++)
	{
		ExpressionValue value = entries[i].evaluate();
		if (!value.isValid())
		{
			Logger::queueError(Logger::Error, "Invalid expression");
			continue;
		}

		if (value.isInt() && mode == EncodingMode::Float)
		{
			int32_t num = getFloatBits((float)value.intValue);
			normalData.push_back(num);
		} else if (value.isInt() && mode == EncodingMode::Double)
		{
			int64_t num = getDoubleBits((double)value.intValue);
			normalData.push_back(num);
		} else if (value.isFloat() && mode == EncodingMode::Float)
		{
			int32_t num = getFloatBits((float)value.floatValue);
			normalData.push_back(num);
		} else if (value.isFloat() && mode == EncodingMode::Double)
		{
			int64_t num = getDoubleBits((double)value.floatValue);
			normalData.push_back(num);
		} else {
			Logger::queueError(Logger::Error, "Invalid expression type");
		}
	}
}